

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove_response.cc
# Opt level: O3

void __thiscall RemoveResponse::RemoveResponse(RemoveResponse *this)

{
  FileInfo *pFVar1;
  
  NamenodeResponse::NamenodeResponse(&this->super_NamenodeResponse);
  (this->super_NamenodeResponse).super_RpcMessage._vptr_RpcMessage =
       (_func_int **)&PTR_Update_00130a90;
  pFVar1 = (FileInfo *)operator_new(0x38);
  FileInfo::FileInfo(pFVar1);
  (this->file_info_).super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileInfo*>
            (&(this->file_info_).super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pFVar1);
  pFVar1 = (FileInfo *)operator_new(0x38);
  FileInfo::FileInfo(pFVar1);
  (this->parent_info_).super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileInfo*>
            (&(this->parent_info_).super___shared_ptr<FileInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pFVar1);
  return;
}

Assistant:

RemoveResponse::RemoveResponse()
    : NamenodeResponse(), file_info_(new FileInfo()),
      parent_info_(new FileInfo()) {}